

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O3

int __thiscall
ncnn::GridSample::forward
          (GridSample *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 w;
  undefined4 w_00;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  pointer pMVar11;
  Mat *this_00;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  void *pvVar23;
  long lVar24;
  int x;
  ulong uVar25;
  long lVar26;
  float *pfVar27;
  void *pvVar28;
  long lVar29;
  int x_00;
  void *pvVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  int y;
  uint uVar36;
  long lVar37;
  void *pvVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined4 uVar54;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  Mat m;
  void *local_298;
  void *local_290;
  undefined8 local_288;
  void *local_260;
  void *local_258;
  void *local_218;
  void *local_208;
  undefined8 uStack_200;
  void *local_1e8;
  void *local_1d8;
  void *local_1c8;
  void *local_1b8;
  ulong local_1a8;
  void *local_188;
  undefined8 uStack_180;
  Mat local_148;
  undefined8 local_f8;
  undefined8 local_e8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  uint local_b4;
  int local_b0;
  int local_ac;
  float local_a8;
  undefined8 local_98;
  ulong local_88;
  void *local_80;
  Mat local_78;
  
  pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  w = pMVar11->w;
  w_00 = pMVar11->h;
  uVar31 = pMVar11->c;
  uVar19 = (ulong)uVar31;
  sVar12 = pMVar11->elemsize;
  if (pMVar11->dims != 4) {
    if (pMVar11->dims != 3) {
      return 0;
    }
    uVar25 = (ulong)(this->permute_fusion == 0);
    iVar5 = (&pMVar11[1].w)[uVar25];
    uVar6 = (&pMVar11[1].h)[uVar25 * 2];
    Mat::create(this_00,iVar5,uVar6,uVar31,sVar12,opt->blob_allocator);
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize = 0;
    local_148.elempack = 0;
    local_148.allocator = (Allocator *)0x0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    Mat::create(&local_148,iVar5,uVar6,pMVar11[1].c,sVar12,opt->workspace_allocator);
    pvVar22 = local_148.data;
    if ((((this_00->data == (void *)0x0) ||
         (sVar12 = this_00->cstep, (long)this_00->c * sVar12 == 0)) ||
        (local_148.data == (void *)0x0)) || ((long)local_148.c * local_148.cstep == 0)) {
      piVar16 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            if (local_148.data != (void *)0x0) {
              free(local_148.data);
            }
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return -100;
    }
    if (this->permute_fusion == 0) {
      if (0 < (int)uVar6) {
        pvVar21 = (void *)(local_148.cstep * local_148.elemsize + (long)local_148.data);
        pvVar23 = pMVar11[1].data;
        sVar13 = pMVar11[1].cstep;
        iVar7 = this->align_corner;
        sVar14 = pMVar11[1].elemsize;
        uVar25 = 0;
        pvVar20 = local_148.data;
        do {
          if (0 < iVar5) {
            lVar33 = 0;
            lVar34 = 0;
            do {
              uVar4 = *(undefined8 *)((long)pvVar23 + lVar34 * 8);
              fVar59 = (float)uVar4;
              fVar61 = (float)((ulong)uVar4 >> 0x20);
              if (iVar7 == 0) {
                fVar59 = (fVar59 + 1.0) * (float)(int)w * 0.5 + -0.5;
                fVar61 = (fVar61 + 1.0) * (float)(int)w_00 * 0.5 + -0.5;
              }
              else {
                fVar59 = (fVar59 * 0.5 + 0.5) * (float)(w + -1);
                fVar61 = (fVar61 * 0.5 + 0.5) * (float)(w_00 + -1);
              }
              *(float *)((long)pvVar20 + lVar34 * 4) = fVar59;
              *(float *)((long)pvVar21 + lVar34 * 4) = fVar61;
              lVar34 = lVar34 + 1;
              lVar33 = lVar33 + -4;
            } while (iVar5 != (int)lVar34);
            pvVar20 = (void *)((long)pvVar20 - lVar33);
            pvVar21 = (void *)((long)pvVar21 - lVar33);
          }
          uVar25 = uVar25 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar13 * sVar14);
        } while (uVar25 != uVar6);
      }
    }
    else if (0 < (int)uVar6) {
      pvVar21 = (void *)(local_148.cstep * local_148.elemsize + (long)local_148.data);
      pvVar23 = pMVar11[1].data;
      pvVar30 = (void *)(pMVar11[1].elemsize * pMVar11[1].cstep + (long)pvVar23);
      iVar7 = this->align_corner;
      uVar32 = 0;
      pvVar20 = local_148.data;
      do {
        if (0 < iVar5) {
          lVar33 = 0;
          lVar34 = 0;
          do {
            fVar59 = *(float *)((long)pvVar23 + lVar34 * 4);
            fVar61 = *(float *)((long)pvVar30 + lVar34 * 4);
            if (iVar7 == 0) {
              fVar59 = (fVar59 + 1.0) * (float)(int)w * 0.5 + -0.5;
              fVar61 = (fVar61 + 1.0) * (float)(int)w_00 * 0.5 + -0.5;
            }
            else {
              fVar59 = (fVar59 * 0.5 + 0.5) * (float)(w + -1);
              fVar61 = (fVar61 * 0.5 + 0.5) * (float)(w_00 + -1);
            }
            *(float *)((long)pvVar20 + lVar34 * 4) = fVar59;
            *(float *)((long)pvVar21 + lVar34 * 4) = fVar61;
            lVar34 = lVar34 + 1;
            lVar33 = lVar33 + -4;
          } while (iVar5 != (int)lVar34);
          pvVar23 = (void *)((long)pvVar23 - lVar33);
          pvVar30 = (void *)((long)pvVar30 - lVar33);
          pvVar20 = (void *)((long)pvVar20 - lVar33);
          pvVar21 = (void *)((long)pvVar21 - lVar33);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar6);
    }
    iVar7 = this->sample_type;
    if (iVar7 == 1) {
      if (0 < (int)uVar31) {
        iVar7 = pMVar11->w;
        iVar8 = pMVar11->h;
        pvVar23 = pMVar11->data;
        sVar13 = pMVar11->elemsize;
        sVar14 = pMVar11->cstep;
        sVar15 = this_00->elemsize;
        pvVar20 = this_00->data;
        pvVar21 = (void *)(local_148.elemsize * local_148.cstep + (long)local_148.data);
        lVar33 = sVar13 * (long)iVar7;
        local_1e8 = (void *)0x0;
        do {
          if (0 < (int)uVar6) {
            lVar34 = sVar14 * sVar13 * (long)local_1e8;
            local_290 = (void *)(sVar12 * sVar15 * (long)local_1e8 + (long)pvVar20);
            iVar9 = this->padding_mode;
            iVar10 = this->align_corner;
            uVar31 = 0;
            local_208 = pvVar22;
            local_218 = pvVar21;
            do {
              if (0 < iVar5) {
                lVar29 = 0;
                lVar37 = 0;
                do {
                  fVar59 = *(float *)((long)local_218 + lVar37 * 4);
                  fVar40 = compute_coord(*(float *)((long)local_208 + lVar37 * 4),w,iVar9,iVar10);
                  fVar41 = compute_coord(fVar59,w_00,iVar9,iVar10);
                  fVar59 = floorf(fVar40);
                  uVar35 = (uint)fVar59;
                  fVar59 = floorf(fVar41);
                  uVar32 = (uint)fVar59;
                  fVar61 = 0.0;
                  fVar59 = 0.0;
                  if ((int)uVar32 < iVar8 && ((int)uVar35 < iVar7 && -1 < (int)(uVar32 | uVar35))) {
                    fVar59 = *(float *)((long)pvVar23 +
                                       (long)(int)uVar35 * 4 + (int)uVar32 * lVar33 + lVar34);
                  }
                  uVar36 = uVar35 + 1;
                  if (((-1 < (int)(uVar36 | uVar32)) && ((int)uVar36 < iVar7)) &&
                     ((int)uVar32 < iVar8)) {
                    fVar61 = *(float *)((long)pvVar23 +
                                       (long)(int)uVar36 * 4 + (int)uVar32 * lVar33 + lVar34);
                  }
                  uVar3 = uVar32 + 1;
                  fVar43 = 0.0;
                  fVar42 = 0.0;
                  if ((int)uVar3 < iVar8 && (-1 < (int)(uVar3 | uVar35) && (int)uVar35 < iVar7)) {
                    fVar42 = *(float *)((long)pvVar23 +
                                       (long)(int)uVar35 * 4 + lVar33 * (int)uVar3 + lVar34);
                  }
                  if ((-1 < (int)(uVar3 | uVar36) && (int)uVar36 < iVar7) && (int)uVar3 < iVar8) {
                    fVar43 = *(float *)((long)pvVar23 +
                                       (long)(int)uVar36 * 4 + (int)uVar3 * lVar33 + lVar34);
                  }
                  fVar40 = fVar40 - (float)(int)uVar35;
                  fVar59 = fVar61 * fVar40 + fVar59 * (1.0 - fVar40);
                  *(float *)((long)local_290 + lVar37 * 4) =
                       ((fVar42 * (1.0 - fVar40) - fVar59) + fVar40 * fVar43) *
                       (fVar41 - (float)(int)uVar32) + fVar59;
                  lVar37 = lVar37 + 1;
                  lVar29 = lVar29 + -4;
                } while (iVar5 != (int)lVar37);
                local_290 = (void *)((long)local_290 - lVar29);
                local_208 = (void *)((long)local_208 - lVar29);
                local_218 = (void *)((long)local_218 - lVar29);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar6);
          }
          local_1e8 = (void *)((long)local_1e8 + 1);
        } while (local_1e8 != (void *)uVar19);
      }
    }
    else if (iVar7 == 2) {
      if (0 < (int)uVar31) {
        iVar7 = pMVar11->w;
        iVar8 = pMVar11->h;
        pvVar23 = pMVar11->data;
        sVar13 = pMVar11->elemsize;
        sVar14 = pMVar11->cstep;
        sVar15 = this_00->elemsize;
        pvVar20 = this_00->data;
        pvVar21 = (void *)(local_148.elemsize * local_148.cstep + (long)local_148.data);
        local_1d8 = (void *)0x0;
        do {
          if (0 < (int)uVar6) {
            local_290 = (void *)(sVar12 * sVar15 * (long)local_1d8 + (long)pvVar20);
            iVar9 = this->padding_mode;
            iVar10 = this->align_corner;
            uVar31 = 0;
            local_208 = pvVar22;
            pvVar30 = pvVar21;
            do {
              if (0 < iVar5) {
                lVar34 = 0;
                lVar33 = 0;
                do {
                  fVar59 = *(float *)((long)pvVar30 + lVar33 * 4);
                  fVar61 = compute_coord(*(float *)((long)local_208 + lVar33 * 4),w,iVar9,iVar10);
                  fVar59 = compute_coord(fVar59,w_00,iVar9,iVar10);
                  fVar61 = floorf(fVar61 + 0.5);
                  uVar35 = (uint)fVar61;
                  fVar59 = floorf(fVar59 + 0.5);
                  uVar32 = (uint)fVar59;
                  uVar54 = 0;
                  if (((-1 < (int)(uVar32 | uVar35)) && ((int)uVar35 < iVar7)) &&
                     ((int)uVar32 < iVar8)) {
                    uVar54 = *(undefined4 *)
                              ((long)pvVar23 +
                              (long)(int)uVar35 * 4 +
                              (long)(int)uVar32 * sVar13 * (long)iVar7 +
                              sVar14 * sVar13 * (long)local_1d8);
                  }
                  *(undefined4 *)((long)local_290 + lVar33 * 4) = uVar54;
                  lVar33 = lVar33 + 1;
                  lVar34 = lVar34 + -4;
                } while (iVar5 != (int)lVar33);
                local_290 = (void *)((long)local_290 - lVar34);
                local_208 = (void *)((long)local_208 - lVar34);
                pvVar30 = (void *)((long)pvVar30 - lVar34);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar6);
          }
          local_1d8 = (void *)((long)local_1d8 + 1);
        } while (local_1d8 != (void *)uVar19);
      }
    }
    else if ((iVar7 == 3) && (0 < (int)uVar31)) {
      uVar25 = 0;
      do {
        local_78.w = pMVar11->w;
        local_78.h = pMVar11->h;
        local_78.c = pMVar11->d;
        local_78.elemsize = pMVar11->elemsize;
        local_78.data = (void *)(pMVar11->cstep * uVar25 * local_78.elemsize + (long)pMVar11->data);
        local_78.elempack = pMVar11->elempack;
        local_78.allocator = pMVar11->allocator;
        local_78.refcount = (int *)0x0;
        local_78.d = 1;
        local_78.dims = pMVar11->dims + -1;
        local_78.cstep =
             (local_78.elemsize * (long)local_78.h * (long)local_78.w + 0xf & 0xfffffffffffffff0) /
             local_78.elemsize;
        if (pMVar11->dims == 4) {
          local_78.cstep = (long)local_78.h * (long)local_78.w;
        }
        if (0 < (int)uVar6) {
          pvVar20 = (void *)(this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
          pvVar23 = (void *)(local_148.elemsize * local_148.cstep + (long)local_148.data);
          local_b0 = this->padding_mode;
          local_ac = this->align_corner;
          uVar31 = 0;
          pvVar22 = local_148.data;
          local_88 = uVar25;
          do {
            if (0 < iVar5) {
              lVar33 = 0;
              lVar34 = 0;
              local_d0 = pvVar23;
              local_c8 = pvVar22;
              local_b4 = uVar31;
              local_80 = pvVar20;
              do {
                fVar59 = *(float *)((long)local_c8 + lVar34 * 4);
                fVar61 = *(float *)((long)local_d0 + lVar34 * 4);
                local_a8 = floorf(fVar59);
                x = (int)local_a8;
                fVar40 = floorf(fVar61);
                iVar10 = local_ac;
                iVar9 = local_b0;
                local_e8 = CONCAT44(extraout_XMM0_Db,fVar40);
                y = (int)fVar40;
                x_00 = x + -1;
                iVar7 = y + -1;
                iVar17 = x + 1;
                iVar8 = y + 1;
                iVar18 = x + 2;
                local_c0 = (void *)CONCAT44(local_c0._4_4_,y + 2);
                fVar40 = get_value_bounded(&local_78,x_00,iVar7,local_b0,local_ac);
                fVar41 = get_value_bounded(&local_78,x,iVar7,iVar9,iVar10);
                fVar42 = get_value_bounded(&local_78,iVar17,iVar7,iVar9,iVar10);
                fVar43 = get_value_bounded(&local_78,iVar18,iVar7,iVar9,iVar10);
                fVar44 = get_value_bounded(&local_78,x_00,y,iVar9,iVar10);
                fVar45 = get_value_bounded(&local_78,x,y,iVar9,iVar10);
                fVar46 = get_value_bounded(&local_78,iVar17,y,iVar9,iVar10);
                local_f8 = CONCAT44(extraout_XMM0_Db_00,fVar46);
                fVar46 = get_value_bounded(&local_78,iVar18,y,iVar9,iVar10);
                fVar47 = get_value_bounded(&local_78,x_00,iVar8,iVar9,iVar10);
                fVar48 = get_value_bounded(&local_78,x,iVar8,iVar9,iVar10);
                fVar49 = get_value_bounded(&local_78,iVar17,iVar8,iVar9,iVar10);
                local_98 = (void *)CONCAT44(extraout_XMM0_Db_01,fVar49);
                fVar49 = get_value_bounded(&local_78,iVar18,iVar8,iVar9,iVar10);
                iVar7 = (int)local_c0;
                fVar50 = get_value_bounded(&local_78,x_00,(int)local_c0,iVar9,iVar10);
                fVar51 = get_value_bounded(&local_78,x,iVar7,iVar9,iVar10);
                fVar52 = get_value_bounded(&local_78,iVar17,iVar7,iVar9,iVar10);
                fVar53 = get_value_bounded(&local_78,iVar18,iVar7,iVar9,iVar10);
                fVar59 = fVar59 - (float)(int)local_a8;
                fVar61 = fVar61 - (float)(int)(float)local_e8;
                fVar55 = fVar59 + 1.0;
                fVar60 = fVar61 + 1.0;
                fVar58 = 1.0 - fVar59;
                fVar56 = (3.0 - fVar55 * 6.0) + (3.75 - fVar55 * 0.75) * fVar55 * fVar55;
                fVar57 = (fVar59 * 1.25 + -2.25) * fVar59 * fVar59 + 1.0;
                fVar58 = (fVar58 * 1.25 + -2.25) * fVar58 * fVar58;
                fVar55 = 1.0 - fVar61;
                fVar59 = (3.0 - fVar60 * 6.0) + (3.75 - fVar60 * 0.75) * fVar60 * fVar60;
                fVar61 = (fVar61 * 1.25 + -2.25) * fVar61 * fVar61 + 1.0;
                fVar55 = (fVar55 * 1.25 + -2.25) * fVar55 * fVar55;
                fVar60 = fVar58 + 1.0;
                fVar58 = fVar56 + fVar58 + fVar57;
                *(float *)((long)local_80 + lVar34 * 4) =
                     (fVar59 + fVar61 + fVar55) *
                     (fVar53 * fVar58 - (fVar52 * fVar60 + fVar57 * fVar51 + fVar56 * fVar50)) +
                     fVar61 * ((fVar60 * (float)local_f8 + fVar44 * fVar56 + fVar45 * fVar57) -
                              fVar46 * fVar58) +
                     (fVar55 + 1.0) *
                     ((fVar60 * (float)local_98 + fVar48 * fVar57 + fVar47 * fVar56) -
                     fVar49 * fVar58) +
                     fVar59 * ((fVar42 * fVar60 + fVar41 * fVar57 + fVar40 * fVar56) -
                              fVar43 * fVar58);
                lVar34 = lVar34 + 1;
                lVar33 = lVar33 + -4;
              } while (iVar5 != (int)lVar34);
              pvVar20 = (void *)((long)local_80 - lVar33);
              pvVar22 = (void *)((long)local_c8 - lVar33);
              pvVar23 = (void *)((long)local_d0 - lVar33);
              uVar31 = local_b4;
            }
            uVar25 = local_88;
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar6);
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + -1;
            UNLOCK();
            if (*local_78.refcount == 0) {
              if (local_78.allocator == (Allocator *)0x0) {
                if (local_78.data != (void *)0x0) {
                  free(local_78.data);
                }
              }
              else {
                (*(local_78.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar19);
    }
    piVar16 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (local_148.allocator != (Allocator *)0x0) {
      (*(local_148.allocator)->_vptr_Allocator[3])();
      return 0;
    }
    if (local_148.data == (void *)0x0) {
      return 0;
    }
    free(local_148.data);
    return 0;
  }
  iVar5 = pMVar11->d;
  bVar39 = this->permute_fusion == 0;
  iVar7 = (&pMVar11[1].w)[bVar39];
  iVar8 = (&pMVar11[1].h)[bVar39];
  uVar6 = (&pMVar11[1].d)[bVar39];
  Mat::create(this_00,iVar7,iVar8,uVar6,uVar31,sVar12,opt->blob_allocator);
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  Mat::create(&local_148,iVar7,iVar8,uVar6,pMVar11[1].c,sVar12,opt->workspace_allocator);
  local_a8 = -NAN;
  if ((((this_00->data == (void *)0x0) ||
       (local_f8 = this_00->cstep, (long)this_00->c * local_f8 == 0)) ||
      (local_290 = local_148.data, local_148.data == (void *)0x0)) ||
     ((long)local_148.c * local_148.cstep == 0)) {
LAB_005965db:
    bVar39 = false;
  }
  else {
    if (this->permute_fusion == 0) {
      if (0 < (int)uVar6) {
        local_260 = (void *)((long)local_148.data + local_148.cstep * local_148.elemsize * 2);
        pvVar23 = (void *)(local_148.cstep * local_148.elemsize + (long)local_148.data);
        pvVar22 = pMVar11[1].data;
        local_e8 = pMVar11[1].cstep * pMVar11[1].elemsize;
        uVar25 = 0;
        do {
          if (0 < iVar8) {
            pfVar27 = (float *)(local_e8 * uVar25 + (long)pvVar22);
            iVar9 = this->padding_mode;
            iVar10 = this->align_corner;
            iVar17 = 0;
            do {
              if (0 < iVar7) {
                lVar34 = 0;
                lVar33 = 0;
                do {
                  fVar59 = pfVar27[1];
                  fVar61 = pfVar27[2];
                  if (iVar10 == 0) {
                    fVar40 = compute_coord((*pfVar27 + 1.0) * (float)(int)w * 0.5 + -0.5,w,iVar9,0);
                    fVar59 = compute_coord((fVar59 + 1.0) * (float)(int)w_00 * 0.5 + -0.5,w_00,iVar9
                                           ,0);
                    fVar61 = (fVar61 + 1.0) * (float)iVar5 * 0.5 + -0.5;
                  }
                  else {
                    fVar40 = compute_coord((*pfVar27 * 0.5 + 0.5) * (float)(w + -1),w,iVar9,iVar10);
                    fVar59 = compute_coord((fVar59 * 0.5 + 0.5) * (float)(w_00 + -1),w_00,iVar9,
                                           iVar10);
                    fVar61 = (fVar61 * 0.5 + 0.5) * (float)(iVar5 + -1);
                  }
                  fVar61 = compute_coord(fVar61,iVar5,iVar9,iVar10);
                  *(float *)((long)local_290 + lVar33 * 4) = fVar40;
                  *(float *)((long)pvVar23 + lVar33 * 4) = fVar59;
                  *(float *)((long)local_260 + lVar33 * 4) = fVar61;
                  pfVar27 = pfVar27 + 3;
                  lVar33 = lVar33 + 1;
                  lVar34 = lVar34 + -4;
                } while (iVar7 != (int)lVar33);
                local_260 = (void *)((long)local_260 - lVar34);
                pvVar23 = (void *)((long)pvVar23 - lVar34);
                local_290 = (void *)((long)local_290 - lVar34);
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar8);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar6);
      }
    }
    else if (0 < (int)uVar6) {
      local_258 = (void *)((long)local_148.data + local_148.cstep * local_148.elemsize * 2);
      local_260 = (void *)(local_148.cstep * local_148.elemsize + (long)local_148.data);
      pvVar22 = pMVar11[1].data;
      lVar33 = pMVar11[1].elemsize * pMVar11[1].cstep;
      uStack_180 = local_188;
      local_188 = (void *)((long)pvVar22 + lVar33 * 2);
      pvVar23 = (void *)(lVar33 + (long)pvVar22);
      uVar32 = 0;
      do {
        local_e8 = (ulong)uVar32;
        if (0 < iVar8) {
          iVar9 = this->padding_mode;
          iVar10 = this->align_corner;
          iVar17 = 0;
          do {
            if (0 < iVar7) {
              lVar33 = 0;
              iVar18 = iVar7;
              do {
                fVar59 = *(float *)((long)pvVar23 + lVar33);
                fVar61 = *(float *)((long)local_188 + lVar33);
                if (iVar10 == 0) {
                  fVar40 = compute_coord((*(float *)((long)pvVar22 + lVar33) + 1.0) *
                                         (float)(int)w * 0.5 + -0.5,w,iVar9,0);
                  fVar59 = compute_coord((fVar59 + 1.0) * (float)(int)w_00 * 0.5 + -0.5,w_00,iVar9,0
                                        );
                  fVar61 = (fVar61 + 1.0) * (float)iVar5 * 0.5 + -0.5;
                }
                else {
                  fVar40 = compute_coord((*(float *)((long)pvVar22 + lVar33) * 0.5 + 0.5) *
                                         (float)(w + -1),w,iVar9,iVar10);
                  fVar59 = compute_coord((fVar59 * 0.5 + 0.5) * (float)(w_00 + -1),w_00,iVar9,iVar10
                                        );
                  fVar61 = (fVar61 * 0.5 + 0.5) * (float)(iVar5 + -1);
                }
                fVar61 = compute_coord(fVar61,iVar5,iVar9,iVar10);
                *(float *)((long)local_290 + lVar33) = fVar40;
                *(float *)((long)local_260 + lVar33) = fVar59;
                *(float *)((long)local_258 + lVar33) = fVar61;
                lVar33 = lVar33 + 4;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
              local_258 = (void *)((long)local_258 + lVar33);
              local_260 = (void *)((long)local_260 + lVar33);
              local_290 = (void *)((long)local_290 + lVar33);
              local_188 = (void *)((long)local_188 + lVar33);
              pvVar23 = (void *)((long)pvVar23 + lVar33);
              pvVar22 = (void *)((long)pvVar22 + lVar33);
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 != iVar8);
        }
        uVar32 = (int)local_e8 + 1;
      } while (uVar32 != uVar6);
    }
    pvVar22 = local_148.data;
    iVar5 = this->sample_type;
    if (iVar5 == 1) {
      if (0 < (int)uVar31) {
        iVar5 = pMVar11->w;
        iVar9 = pMVar11->h;
        iVar10 = pMVar11->d;
        pvVar22 = pMVar11->data;
        local_e8 = pMVar11->cstep * pMVar11->elemsize;
        local_f8 = local_f8 * this_00->elemsize;
        local_c0 = this_00->data;
        local_c8 = (void *)((long)local_148.data + local_148.elemsize * local_148.cstep);
        local_98 = local_148.data;
        local_d0 = (void *)((long)local_148.data + local_148.elemsize * local_148.cstep * 2);
        lVar34 = pMVar11->elemsize * (long)iVar5;
        lVar33 = iVar9 * lVar34;
        local_1a8 = 0;
        do {
          if (0 < (int)uVar6) {
            lVar29 = local_e8 * local_1a8;
            local_1b8 = (void *)(local_f8 * local_1a8 + (long)local_c0);
            uVar31 = 0;
            local_1c8 = local_d0;
            local_1d8 = local_c8;
            local_1e8 = local_98;
            do {
              if (0 < iVar8) {
                iVar17 = 0;
                do {
                  if (0 < iVar7) {
                    lVar37 = 0;
                    lVar26 = 0;
                    do {
                      fVar59 = *(float *)((long)local_1e8 + lVar26 * 4);
                      fVar61 = *(float *)((long)local_1d8 + lVar26 * 4);
                      fVar40 = *(float *)((long)local_1c8 + lVar26 * 4);
                      fVar41 = floorf(fVar59);
                      uVar36 = (uint)fVar41;
                      fVar41 = floorf(fVar61);
                      uVar35 = (uint)fVar41;
                      fVar41 = floorf(fVar40);
                      uVar32 = (uint)fVar41;
                      fVar42 = 0.0;
                      lVar24 = (long)(int)uVar35;
                      fVar41 = 0.0;
                      if (((-1 < (int)(uVar35 | uVar36 | uVar32)) && ((int)uVar36 < iVar5)) &&
                         (((int)uVar35 < iVar9 && ((int)uVar32 < iVar10)))) {
                        fVar41 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar36 * 4 +
                                           lVar34 * lVar24 + (int)uVar32 * lVar33 + lVar29);
                      }
                      uVar3 = uVar36 + 1;
                      if (((-1 < (int)(uVar3 | uVar35 | uVar32)) && ((int)uVar3 < iVar5)) &&
                         (((int)uVar35 < iVar9 && ((int)uVar32 < iVar10)))) {
                        fVar42 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar3 * 4 +
                                           lVar34 * lVar24 + (int)uVar32 * lVar33 + lVar29);
                      }
                      uVar1 = uVar35 + 1;
                      fVar44 = 0.0;
                      fVar43 = 0.0;
                      if ((((-1 < (int)(uVar1 | uVar36 | uVar32)) && ((int)uVar36 < iVar5)) &&
                          ((int)uVar1 < iVar9)) && ((int)uVar32 < iVar10)) {
                        fVar43 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar36 * 4 +
                                           (int)uVar1 * lVar34 + (int)uVar32 * lVar33 + lVar29);
                      }
                      if (((-1 < (int)(uVar1 | uVar3 | uVar32)) && ((int)uVar3 < iVar5)) &&
                         (((int)uVar1 < iVar9 && ((int)uVar32 < iVar10)))) {
                        fVar44 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar3 * 4 +
                                           (int)uVar1 * lVar34 + (int)uVar32 * lVar33 + lVar29);
                      }
                      uVar2 = uVar32 + 1;
                      fVar46 = 0.0;
                      fVar45 = 0.0;
                      if ((int)uVar2 < iVar10 &&
                          (((int)uVar36 < iVar5 && (int)uVar35 < iVar9) &&
                          -1 < (int)(uVar35 | uVar36 | uVar2))) {
                        fVar45 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar36 * 4 +
                                           (int)uVar2 * lVar33 + lVar34 * lVar24 + lVar29);
                      }
                      if ((((int)uVar35 < iVar9 && (int)uVar3 < iVar5) &&
                          -1 < (int)(uVar3 | uVar35 | uVar2)) && (int)uVar2 < iVar10) {
                        fVar46 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar3 * 4 +
                                           (int)uVar2 * lVar33 + lVar24 * lVar34 + lVar29);
                      }
                      fVar48 = 0.0;
                      fVar47 = 0.0;
                      if (((-1 < (int)(uVar1 | uVar36 | uVar2)) && ((int)uVar36 < iVar5)) &&
                         (((int)uVar1 < iVar9 && ((int)uVar2 < iVar10)))) {
                        fVar47 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar36 * 4 +
                                           (int)uVar1 * lVar34 + (int)uVar2 * lVar33 + lVar29);
                      }
                      if ((((-1 < (int)(uVar1 | uVar3 | uVar2)) && ((int)uVar3 < iVar5)) &&
                          ((int)uVar1 < iVar9)) && ((int)uVar2 < iVar10)) {
                        fVar48 = *(float *)((long)pvVar22 +
                                           (long)(int)uVar3 * 4 +
                                           (int)uVar1 * lVar34 + (int)uVar2 * lVar33 + lVar29);
                      }
                      fVar59 = fVar59 - (float)(int)uVar36;
                      fVar61 = fVar61 - (float)(int)uVar35;
                      fVar49 = 1.0 - fVar59;
                      fVar41 = fVar61 * (fVar44 * fVar59 + fVar43 * fVar49) +
                               (1.0 - fVar61) * (fVar41 * fVar49 + fVar42 * fVar59);
                      *(float *)((long)local_1b8 + lVar26 * 4) =
                           (((1.0 - fVar61) * (fVar45 * fVar49 + fVar46 * fVar59) - fVar41) +
                           fVar61 * (fVar48 * fVar59 + fVar47 * fVar49)) *
                           (fVar40 - (float)(int)uVar32) + fVar41;
                      lVar26 = lVar26 + 1;
                      lVar37 = lVar37 + -4;
                    } while (iVar7 != (int)lVar26);
                    local_1c8 = (void *)((long)local_1c8 - lVar37);
                    local_1d8 = (void *)((long)local_1d8 - lVar37);
                    local_1e8 = (void *)((long)local_1e8 - lVar37);
                    local_1b8 = (void *)((long)local_1b8 - lVar37);
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 != iVar8);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar6);
          }
          local_1a8 = local_1a8 + 1;
        } while (local_1a8 != uVar19);
      }
    }
    else {
      if (iVar5 != 2) {
        bVar39 = true;
        if (iVar5 != 3) goto LAB_005965dd;
        forward();
        local_a8 = -NAN;
        goto LAB_005965db;
      }
      if (0 < (int)uVar31) {
        iVar5 = pMVar11->w;
        iVar9 = pMVar11->h;
        iVar10 = pMVar11->d;
        pvVar21 = pMVar11->data;
        sVar12 = pMVar11->elemsize;
        sVar13 = pMVar11->cstep;
        local_f8 = local_f8 * this_00->elemsize;
        pvVar30 = this_00->data;
        pvVar23 = (void *)((long)local_148.data + local_148.elemsize * local_148.cstep);
        pvVar20 = (void *)((long)local_148.data + local_148.elemsize * local_148.cstep * 2);
        lVar33 = sVar12 * (long)iVar5;
        local_1c8 = (void *)0x0;
        do {
          if (0 < (int)uVar6) {
            local_288 = (void *)(local_f8 * (long)local_1c8 + (long)pvVar30);
            uVar31 = 0;
            pvVar28 = pvVar22;
            pvVar38 = pvVar23;
            local_298 = pvVar20;
            do {
              if (0 < iVar8) {
                iVar17 = 0;
                do {
                  if (0 < iVar7) {
                    lVar29 = 0;
                    lVar34 = 0;
                    do {
                      fVar59 = floorf(*(float *)((long)pvVar28 + lVar34 * 4) + 0.5);
                      uVar35 = (uint)fVar59;
                      fVar59 = floorf(*(float *)((long)pvVar38 + lVar34 * 4) + 0.5);
                      uVar36 = (uint)fVar59;
                      fVar59 = floorf(*(float *)((long)local_298 + lVar34 * 4) + 0.5);
                      uVar32 = (uint)fVar59;
                      uVar54 = 0;
                      if (((-1 < (int)(uVar36 | uVar35 | uVar32)) && ((int)uVar35 < iVar5)) &&
                         (((int)uVar36 < iVar9 && ((int)uVar32 < iVar10)))) {
                        uVar54 = *(undefined4 *)
                                  ((long)pvVar21 +
                                  (long)(int)uVar35 * 4 +
                                  (int)uVar36 * lVar33 +
                                  (long)(int)uVar32 * iVar9 * lVar33 +
                                  sVar13 * sVar12 * (long)local_1c8);
                      }
                      *(undefined4 *)((long)local_288 + lVar34 * 4) = uVar54;
                      lVar34 = lVar34 + 1;
                      lVar29 = lVar29 + -4;
                    } while (iVar7 != (int)lVar34);
                    local_298 = (void *)((long)local_298 - lVar29);
                    pvVar38 = (void *)((long)pvVar38 - lVar29);
                    pvVar28 = (void *)((long)pvVar28 - lVar29);
                    local_288 = (void *)((long)local_288 - lVar29);
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 != iVar8);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar6);
          }
          local_1c8 = (void *)((long)local_1c8 + 1);
        } while (local_1c8 != (void *)uVar19);
      }
    }
    bVar39 = true;
  }
LAB_005965dd:
  piVar16 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (bVar39) {
    return 0;
  }
  return (int)local_a8;
}

Assistant:

int GridSample::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 3)
    {
        int outw = permute_fusion == 0 ? grid.h : grid.w;
        int outh = permute_fusion == 0 ? grid.c : grid.h;

        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);

        Mat offset_blob;
        offset_blob.create(outw, outh, grid.c, elemsize, opt.workspace_allocator);

        if (top_blob.empty() || offset_blob.empty())
            return -100;

        //pre-calculate all interpolation offsets for each x y, unpack grid on-the-fly
        if (permute_fusion == 0)
        {
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);

            for (int y = 0; y < outh; y++)
            {
                const float* gridptr = grid.channel(y);
                for (int x = 0; x < outw; x++)
                {
                    float sample_x = gridptr[0];
                    float sample_y = gridptr[1];

                    sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                    sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                    *offsetptr_x = sample_x;
                    *offsetptr_y = sample_y;

                    gridptr += 2;
                    offsetptr_x++;
                    offsetptr_y++;
                }
            }
        }
        else
        {
            const float* gridptr_x = grid.channel(0);
            const float* gridptr_y = grid.channel(1);
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);

            for (int y = 0; y < outh; y++)
            {
                for (int x = 0; x < outw; x++)
                {
                    float sample_x = *gridptr_x;
                    float sample_y = *gridptr_y;

                    sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                    sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                    *offsetptr_x = sample_x;
                    *offsetptr_y = sample_y;

                    gridptr_x++;
                    gridptr_y++;
                    offsetptr_x++;
                    offsetptr_y++;
                }
            }
        }

        if (sample_type == Interpolation_BILINEAR) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;

                        // bilinear interpolate
                        float v;
                        {
                            sample_x = compute_coord(sample_x, w, padding_mode, align_corner);
                            sample_y = compute_coord(sample_y, h, padding_mode, align_corner);
                            int x0 = floor(sample_x);
                            int y0 = floor(sample_y);
                            int x1 = x0 + 1;
                            int y1 = y0 + 1;

                            float v00 = get_value_bounded(image, x0, y0);
                            float v01 = get_value_bounded(image, x1, y0);
                            float v10 = get_value_bounded(image, x0, y1);
                            float v11 = get_value_bounded(image, x1, y1);

                            float alpha = sample_x - x0;
                            float beta = sample_y - y0;

                            float v0 = v00 * (1 - alpha) + v01 * alpha;
                            float v1 = v10 * (1 - alpha) + v11 * alpha;

                            v = v0 * (1 - beta) + v1 * beta;
                        }

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
        else if (sample_type == Interpolation_NEAREST) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        int x0 = static_cast<int>(floor(sample_x + 0.5f));
                        int y0 = static_cast<int>(floor(sample_y + 0.5f));

                        float v = get_value_bounded(image, x0, y0);

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
        else if (sample_type == Interpolation_BICUBIC) // bicubic
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;

                        // bicubic interpolate
                        float v;
                        {
                            int x1 = (int)floorf(sample_x);
                            int y1 = (int)floorf(sample_y);
                            int x0 = x1 - 1;
                            int y0 = y1 - 1;
                            int x2 = x1 + 1;
                            int y2 = y1 + 1;
                            int x3 = x1 + 2;
                            int y3 = y1 + 2;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v02 = get_value_bounded(image, x2, y0, padding_mode, align_corner);
                            float v03 = get_value_bounded(image, x3, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);
                            float v12 = get_value_bounded(image, x2, y1, padding_mode, align_corner);
                            float v13 = get_value_bounded(image, x3, y1, padding_mode, align_corner);
                            float v20 = get_value_bounded(image, x0, y2, padding_mode, align_corner);
                            float v21 = get_value_bounded(image, x1, y2, padding_mode, align_corner);
                            float v22 = get_value_bounded(image, x2, y2, padding_mode, align_corner);
                            float v23 = get_value_bounded(image, x3, y2, padding_mode, align_corner);
                            float v30 = get_value_bounded(image, x0, y3, padding_mode, align_corner);
                            float v31 = get_value_bounded(image, x1, y3, padding_mode, align_corner);
                            float v32 = get_value_bounded(image, x2, y3, padding_mode, align_corner);
                            float v33 = get_value_bounded(image, x3, y3, padding_mode, align_corner);

                            float x_coeffs[4];
                            float y_coeffs[4];
                            interpolate_cubic(sample_x - x1, x_coeffs);
                            interpolate_cubic(sample_y - y1, y_coeffs);

                            float v0 = v00 * x_coeffs[0] + v01 * x_coeffs[1] + v02 * x_coeffs[2] + v03 * x_coeffs[3];
                            float v1 = v10 * x_coeffs[0] + v11 * x_coeffs[1] + v12 * x_coeffs[2] + v13 * x_coeffs[3];
                            float v2 = v20 * x_coeffs[0] + v21 * x_coeffs[1] + v22 * x_coeffs[2] + v23 * x_coeffs[3];
                            float v3 = v30 * x_coeffs[0] + v31 * x_coeffs[1] + v32 * x_coeffs[2] + v33 * x_coeffs[3];

                            v = v0 * y_coeffs[0] + v1 * y_coeffs[1] + v2 * y_coeffs[2] + v3 * y_coeffs[3];
                        }

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
    }

    if (dims == 4)
    {
        int outw = permute_fusion == 0 ? grid.h : grid.w;
        int outh = permute_fusion == 0 ? grid.d : grid.h;
        int outd = permute_fusion == 0 ? grid.c : grid.d;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);

        Mat offset_blob;
        offset_blob.create(outw, outh, outd, grid.c, elemsize, opt.workspace_allocator);

        if (top_blob.empty() || offset_blob.empty())
            return -100;

        //pre-calculate all interpolation offsets for each x y, unpack grid on-the-fly
        if (permute_fusion == 0)
        {
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);
            float* offsetptr_z = offset_blob.channel(2);

            for (int z = 0; z < outd; z++)
            {
                const float* gridptr = grid.channel(z);
                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];
                        float sample_z = gridptr[2];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);

                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        sample_z = grid_sample_unormalize(d, sample_z, align_corner);
                        sample_z = compute_coord(sample_z, d, padding_mode, align_corner);

                        *offsetptr_x = sample_x;
                        *offsetptr_y = sample_y;
                        *offsetptr_z = sample_z;

                        gridptr += 3;
                        offsetptr_x++;
                        offsetptr_y++;
                        offsetptr_z++;
                    }
                }
            }
        }
        else
        {
            const float* gridptr_x = grid.channel(0);
            const float* gridptr_y = grid.channel(1);
            const float* gridptr_z = grid.channel(2);
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);
            float* offsetptr_z = offset_blob.channel(2);

            for (int z = 0; z < outd; z++)
            {
                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *gridptr_x;
                        float sample_y = *gridptr_y;
                        float sample_z = *gridptr_z;

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);

                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        sample_z = grid_sample_unormalize(d, sample_z, align_corner);
                        sample_z = compute_coord(sample_z, d, padding_mode, align_corner);

                        *offsetptr_x = sample_x;
                        *offsetptr_y = sample_y;
                        *offsetptr_z = sample_z;

                        gridptr_x++;
                        gridptr_y++;
                        gridptr_z++;
                        offsetptr_x++;
                        offsetptr_y++;
                        offsetptr_z++;
                    }
                }
            }
        }

        if (sample_type == Interpolation_BILINEAR) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);
                const float* offsetptr_z = offset_blob.channel(2);

                for (int z = 0; z < outd; z++)
                {
                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = *offsetptr_x;
                            float sample_y = *offsetptr_y;
                            float sample_z = *offsetptr_z;

                            // bilinear interpolate
                            float v;
                            {
                                int x0 = (int)floor(sample_x);
                                int y0 = (int)floor(sample_y);
                                int z0 = (int)floor(sample_z);
                                int x1 = x0 + 1;
                                int y1 = y0 + 1;
                                int z1 = z0 + 1;

                                float v000 = get_value_bounded(image, x0, y0, z0);
                                float v001 = get_value_bounded(image, x1, y0, z0);
                                float v010 = get_value_bounded(image, x0, y1, z0);
                                float v011 = get_value_bounded(image, x1, y1, z0);
                                float v100 = get_value_bounded(image, x0, y0, z1);
                                float v101 = get_value_bounded(image, x1, y0, z1);
                                float v110 = get_value_bounded(image, x0, y1, z1);
                                float v111 = get_value_bounded(image, x1, y1, z1);

                                float alpha = sample_x - x0;
                                float beta = sample_y - y0;
                                float gamma = sample_z - z0;

                                float v00 = v000 * (1 - alpha) + v001 * alpha;
                                float v01 = v010 * (1 - alpha) + v011 * alpha;
                                float v10 = v100 * (1 - alpha) + v101 * alpha;
                                float v11 = v110 * (1 - alpha) + v111 * alpha;

                                float v0 = v00 * (1 - beta) + v01 * beta;
                                float v1 = v10 * (1 - beta) + v11 * beta;

                                v = v0 * (1 - gamma) + v1 * gamma;
                            }

                            outptr[0] = v;
                            outptr += 1;

                            offsetptr_x++;
                            offsetptr_y++;
                            offsetptr_z++;
                        }
                    }
                }
            }
        }
        else if (sample_type == Interpolation_NEAREST) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);
                const float* offsetptr_z = offset_blob.channel(2);

                for (int z = 0; z < outd; z++)
                {
                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = *offsetptr_x;
                            float sample_y = *offsetptr_y;
                            float sample_z = *offsetptr_z;

                            int x0 = static_cast<int>(floor(sample_x + 0.5f));
                            int y0 = static_cast<int>(floor(sample_y + 0.5f));
                            int z0 = static_cast<int>(floor(sample_z + 0.5f));

                            float v = get_value_bounded(image, x0, y0, z0);

                            outptr[0] = v;
                            outptr += 1;

                            offsetptr_x++;
                            offsetptr_y++;
                            offsetptr_z++;
                        }
                    }
                }
            }
        }
        else if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -1;
        }
    }

    return 0;
}